

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

void __thiscall absl::lts_20240722::flags_internal::FlagImpl::Init(FlagImpl *this)

{
  FlagDfltGenFunc p_Var1;
  FlagValueStorageKind FVar2;
  pointer pvVar3;
  size_t sVar4;
  atomic<long> *paVar5;
  long lVar6;
  atomic<unsigned_long> *paVar7;
  atomic<absl::lts_20240722::flags_internal::MaskedPointer> *paVar8;
  void *pvVar9;
  MaskedPointer local_58;
  MaskedPointer local_50;
  MaskedPointer ptr_value;
  uint8_t initialized;
  array<char,_8UL> buf;
  FlagDefaultKind def_kind;
  FlagImpl *this_local;
  memory_order __b;
  
  Mutex::Mutex((Mutex *)this->data_guard_);
  buf._M_elems[7] = this->field_0x29 & 3;
  FVar2 = ValueStorageKind(this);
  if (FVar2 < kSequenceLocked) {
    memset(&stack0xffffffffffffffc0,0,8);
    if (buf._M_elems[7] == '\x01') {
      p_Var1 = (this->default_value_).gen_func;
      pvVar3 = std::array<char,_8UL>::data((array<char,_8UL> *)&stack0xffffffffffffffc0);
      (*p_Var1)(pvVar3);
    }
    else {
      if (buf._M_elems[7] == '\0') {
        __assert_fail("def_kind != FlagDefaultKind::kDynamicValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/flags/internal/flag.cc"
                      ,0xcf,"void absl::flags_internal::FlagImpl::Init()");
      }
      pvVar3 = std::array<char,_8UL>::data((array<char,_8UL> *)&stack0xffffffffffffffc0);
      sVar4 = Sizeof(this->op_);
      memcpy(pvVar3,&this->default_value_,sVar4);
    }
    FVar2 = ValueStorageKind(this);
    if (FVar2 == kValueAndInitBit) {
      ptr_value.ptr_._7_1_ = '\x01';
      pvVar3 = std::array<char,_8UL>::data((array<char,_8UL> *)&stack0xffffffffffffffc0);
      sVar4 = Sizeof(this->op_);
      pvVar3[sVar4] = ptr_value.ptr_._7_1_;
    }
    paVar5 = OneWordValue(this);
    lVar6 = bit_cast<long,_std::array<char,_8UL>,_0>((array<char,_8UL> *)&stack0xffffffffffffffc0);
    std::operator&(memory_order_release,__memory_order_mask);
    (paVar5->super___atomic_base<long>)._M_i = lVar6;
  }
  else if (FVar2 == kSequenceLocked) {
    if (buf._M_elems[7] != '\x01') {
      __assert_fail("def_kind == FlagDefaultKind::kGenFunc",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/flags/internal/flag.cc"
                    ,0xe1,"void absl::flags_internal::FlagImpl::Init()");
    }
    p_Var1 = (this->default_value_).gen_func;
    paVar7 = AtomicBufferValue(this);
    (*p_Var1)(paVar7);
  }
  else if (FVar2 == kHeapAllocated) {
    if (buf._M_elems[7] != '\x01') {
      __assert_fail("def_kind == FlagDefaultKind::kGenFunc",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/flags/internal/flag.cc"
                    ,0xe8,"void absl::flags_internal::FlagImpl::Init()");
    }
    paVar8 = PtrStorage(this);
    local_50 = std::atomic<absl::lts_20240722::flags_internal::MaskedPointer>::load
                         (paVar8,memory_order_acquire);
    p_Var1 = (this->default_value_).gen_func;
    pvVar9 = MaskedPointer::Ptr(&local_50);
    (*p_Var1)(pvVar9);
    paVar8 = PtrStorage(this);
    pvVar9 = MaskedPointer::Ptr(&local_50);
    MaskedPointer::MaskedPointer(&local_58,pvVar9,true);
    std::atomic<absl::lts_20240722::flags_internal::MaskedPointer>::store
              (paVar8,local_58,memory_order_release);
  }
  SequenceLock::MarkInitialized(&this->seq_lock_);
  return;
}

Assistant:

void FlagImpl::Init() {
  new (&data_guard_) absl::Mutex;

  auto def_kind = static_cast<FlagDefaultKind>(def_kind_);

  switch (ValueStorageKind()) {
    case FlagValueStorageKind::kValueAndInitBit:
    case FlagValueStorageKind::kOneWordAtomic: {
      alignas(int64_t) std::array<char, sizeof(int64_t)> buf{};
      if (def_kind == FlagDefaultKind::kGenFunc) {
        (*default_value_.gen_func)(buf.data());
      } else {
        assert(def_kind != FlagDefaultKind::kDynamicValue);
        std::memcpy(buf.data(), &default_value_, Sizeof(op_));
      }
      if (ValueStorageKind() == FlagValueStorageKind::kValueAndInitBit) {
        // We presume here the memory layout of FlagValueAndInitBit struct.
        uint8_t initialized = 1;
        std::memcpy(buf.data() + Sizeof(op_), &initialized,
                    sizeof(initialized));
      }
      // Type can contain valid uninitialized bits, e.g. padding.
      ABSL_ANNOTATE_MEMORY_IS_INITIALIZED(buf.data(), buf.size());
      OneWordValue().store(absl::bit_cast<int64_t>(buf),
                           std::memory_order_release);
      break;
    }
    case FlagValueStorageKind::kSequenceLocked: {
      // For this storage kind the default_value_ always points to gen_func
      // during initialization.
      assert(def_kind == FlagDefaultKind::kGenFunc);
      (*default_value_.gen_func)(AtomicBufferValue());
      break;
    }
    case FlagValueStorageKind::kHeapAllocated:
      // For this storage kind the default_value_ always points to gen_func
      // during initialization.
      assert(def_kind == FlagDefaultKind::kGenFunc);
      // Flag value initially points to the internal buffer.
      MaskedPointer ptr_value = PtrStorage().load(std::memory_order_acquire);
      (*default_value_.gen_func)(ptr_value.Ptr());
      // Default value is a candidate for an unprotected read.
      PtrStorage().store(MaskedPointer(ptr_value.Ptr(), true),
                         std::memory_order_release);
      break;
  }
  seq_lock_.MarkInitialized();
}